

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuStringTemplate.cpp
# Opt level: O0

string * __thiscall
tcu::StringTemplate::specialize
          (string *__return_storage_ptr__,StringTemplate *this,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *params)

{
  size_t sVar1;
  bool bVar2;
  InternalError *pIVar3;
  long lVar4;
  char *pcVar5;
  reference ppVar6;
  string *psVar7;
  ulong uVar8;
  allocator<char> local_361;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_360;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_340;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_320;
  ulong local_300;
  size_t ndx;
  string tmp;
  string *val;
  _Self local_2c0;
  undefined1 local_2b2;
  allocator<char> local_2b1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_290;
  undefined1 local_270 [8];
  string flagsStr;
  size_t colonNdx;
  string paramName;
  undefined1 local_200 [6];
  bool paramOptional;
  bool paramSingleLine;
  string paramStr;
  size_t paramEndNdx;
  string local_1c8 [32];
  long local_1a8;
  size_t paramNdx;
  size_t curNdx;
  ostringstream res;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *params_local;
  StringTemplate *this_local;
  
  res._368_8_ = params;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&curNdx);
  paramNdx = 0;
  while( true ) {
    local_1a8 = std::__cxx11::string::find((char *)this,0x2c75af2);
    sVar1 = paramNdx;
    if (local_1a8 == -1) {
      uVar8 = std::__cxx11::string::length();
      if (sVar1 < uVar8) {
        pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)this);
        std::operator<<((ostream *)&curNdx,pcVar5);
      }
      std::__cxx11::ostringstream::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&curNdx);
      return __return_storage_ptr__;
    }
    std::__cxx11::string::substr((ulong)local_1c8,(ulong)this);
    std::operator<<((ostream *)&curNdx,local_1c8);
    std::__cxx11::string::~string(local_1c8);
    paramStr.field_2._8_8_ = std::__cxx11::string::find((char *)this,0x2b6f7db);
    if (paramStr.field_2._8_8_ == -1) break;
    std::__cxx11::string::substr((ulong)local_200,(ulong)this);
    paramName.field_2._M_local_buf[0xf] = '\0';
    paramName.field_2._M_local_buf[0xe] = '\0';
    std::__cxx11::string::string((string *)&colonNdx);
    lVar4 = std::__cxx11::string::find(local_200,0x2b48a4a);
    if (lVar4 == -1) {
      std::__cxx11::string::operator=((string *)&colonNdx,(string *)local_200);
    }
    else {
      std::__cxx11::string::substr((ulong)((long)&flagsStr.field_2 + 8),(ulong)local_200);
      std::__cxx11::string::operator=
                ((string *)&colonNdx,(string *)(flagsStr.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)(flagsStr.field_2._M_local_buf + 8));
      std::__cxx11::string::substr((ulong)local_270,(ulong)local_200);
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_270,"single-line");
      if (bVar2) {
        paramName.field_2._M_local_buf[0xf] = '\x01';
      }
      else {
        bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_270,"opt");
        if (!bVar2) {
          local_2b2 = 1;
          pIVar3 = (InternalError *)__cxa_allocate_exception(0x38);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_2b0,"Unrecognized flag",&local_2b1);
          std::operator+(&local_290,&local_2b0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_200);
          pcVar5 = (char *)std::__cxx11::string::c_str();
          InternalError::InternalError
                    (pIVar3,pcVar5,(char *)0x0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/common/tcuStringTemplate.cpp"
                     ,0x5c);
          local_2b2 = 0;
          __cxa_throw(pIVar3,&InternalError::typeinfo,InternalError::~InternalError);
        }
        paramName.field_2._M_local_buf[0xe] = '\x01';
      }
      std::__cxx11::string::~string((string *)local_270);
    }
    local_2c0._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)res._368_8_,(key_type *)&colonNdx);
    val = (string *)
          std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)res._368_8_);
    bVar2 = std::operator!=(&local_2c0,(_Self *)&val);
    if (bVar2) {
      tmp.field_2._8_8_ =
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)res._368_8_,(key_type *)&colonNdx);
      ppVar6 = std::
               _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator*((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)((long)&tmp.field_2 + 8));
      if ((paramName.field_2._M_local_buf[0xf] & 1U) == 0) {
        std::operator<<((ostream *)&curNdx,(string *)&ppVar6->second);
      }
      else {
        std::__cxx11::string::string((string *)&ndx,(string *)&ppVar6->second);
        local_300 = std::__cxx11::string::find((char *)&ndx,0x2b8f97b);
        while (local_300 != 0xffffffffffffffff) {
          psVar7 = (string *)std::__cxx11::string::replace((ulong)&ndx,local_300,&DAT_00000001);
          std::__cxx11::string::operator=((string *)&ndx,psVar7);
          local_300 = std::__cxx11::string::find((char *)&ndx,0x2b8f97b);
        }
        std::operator<<((ostream *)&curNdx,(string *)&ndx);
        std::__cxx11::string::~string((string *)&ndx);
      }
    }
    else if ((paramName.field_2._M_local_buf[0xe] & 1U) == 0) {
      pIVar3 = (InternalError *)__cxa_allocate_exception(0x38);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_360,"Value for parameter \'",&local_361);
      std::operator+(&local_340,&local_360,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&colonNdx)
      ;
      std::operator+(&local_320,&local_340,"\' not found in map");
      pcVar5 = (char *)std::__cxx11::string::c_str();
      InternalError::InternalError
                (pIVar3,pcVar5,(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/common/tcuStringTemplate.cpp"
                 ,0x71);
      __cxa_throw(pIVar3,&InternalError::typeinfo,InternalError::~InternalError);
    }
    paramNdx = paramStr.field_2._8_8_ + 1;
    std::__cxx11::string::~string((string *)&colonNdx);
    std::__cxx11::string::~string((string *)local_200);
  }
  pIVar3 = (InternalError *)__cxa_allocate_exception(0x38);
  InternalError::InternalError
            (pIVar3,"No \'}\' found in template parameter",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/common/tcuStringTemplate.cpp"
             ,0x46);
  __cxa_throw(pIVar3,&InternalError::typeinfo,InternalError::~InternalError);
}

Assistant:

string StringTemplate::specialize (const map<string, string>& params) const
{
	ostringstream res;

	size_t curNdx = 0;
	for (;;)
	{
		size_t paramNdx = m_template.find("${", curNdx);
		if (paramNdx != string::npos)
		{
			// Append in-between stuff.
			res << m_template.substr(curNdx, paramNdx - curNdx);

			// Find end-of-param.
			size_t paramEndNdx = m_template.find("}", paramNdx);
			if (paramEndNdx == string::npos)
				TCU_THROW(InternalError, "No '}' found in template parameter");

			// Parse parameter contents.
			string	paramStr		= m_template.substr(paramNdx+2, paramEndNdx-2-paramNdx);
			bool	paramSingleLine	= false;
			bool	paramOptional	= false;
			string	paramName;
			size_t colonNdx = paramStr.find(":");
			if (colonNdx != string::npos)
			{
				paramName = paramStr.substr(0, colonNdx);
				string flagsStr = paramStr.substr(colonNdx+1);
				if (flagsStr == "single-line")
				{
					paramSingleLine = true;
				}
				else if (flagsStr == "opt")
				{
					paramOptional = true;
				}
				else
				{
					TCU_THROW(InternalError, (string("Unrecognized flag") + paramStr).c_str());
				}
			}
			else
				paramName = paramStr;

			// Fill in parameter value.
			if (params.find(paramName) != params.end())
			{
				const string& val = (*params.find(paramName)).second;
				if (paramSingleLine)
				{
					string tmp = val;
					for (size_t ndx = tmp.find("\n"); ndx != string::npos; ndx = tmp.find("\n"))
						tmp = tmp.replace(ndx, 1, " ");
					res << tmp;
				}
				else
					res << val;
			}
			else if (!paramOptional)
				TCU_THROW(InternalError, (string("Value for parameter '") + paramName + "' not found in map").c_str());

			// Skip over template.
			curNdx = paramEndNdx + 1;
		}
		else
		{
			if (curNdx < m_template.length())
				res << &m_template[curNdx];

			break;
		}
	}

	return res.str();
}